

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
* vkt::sr::anon_unknown_0::makePixelOffsetsFunctor
            (MovePtr<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
             *__return_storage_ptr__,GatherType gatherType,GatherArgs *gatherArgs,IVec2 *offsetRange
            )

{
  PixelOffsets *pPVar1;
  SinglePixelOffsets *this;
  IVec2 offset;
  IVec2 local_20;
  
  if (gatherType < GATHERTYPE_OFFSET_DYNAMIC) {
    if (gatherType == GATHERTYPE_BASIC) {
      local_20.m_data[0] = 0;
      local_20.m_data[1] = 0;
    }
    else {
      local_20.m_data = *&gatherArgs->offsets[0].m_data;
    }
    this = (SinglePixelOffsets *)operator_new(0x28);
    SinglePixelOffsets::SinglePixelOffsets(this,&local_20);
    (__return_storage_ptr__->
    super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ).m_data.ptr = (PixelOffsets *)this;
  }
  else {
    if (gatherType == GATHERTYPE_OFFSETS) {
      pPVar1 = (PixelOffsets *)operator_new(0x28);
      pPVar1->_vptr_PixelOffsets = (_func_int **)&PTR_operator___00d26f68;
      pPVar1[1]._vptr_PixelOffsets = (_func_int **)0x0;
      pPVar1[2]._vptr_PixelOffsets = (_func_int **)0x0;
      pPVar1[3]._vptr_PixelOffsets = (_func_int **)0x0;
      pPVar1[4]._vptr_PixelOffsets = (_func_int **)0x0;
      pPVar1[1]._vptr_PixelOffsets = *(_func_int ***)gatherArgs->offsets[0].m_data;
      pPVar1[2]._vptr_PixelOffsets = *(_func_int ***)gatherArgs->offsets[1].m_data;
      pPVar1[3]._vptr_PixelOffsets = *(_func_int ***)gatherArgs->offsets[2].m_data;
      pPVar1[4]._vptr_PixelOffsets = *(_func_int ***)gatherArgs->offsets[3].m_data;
    }
    else {
      if (gatherType != GATHERTYPE_OFFSET_DYNAMIC) {
        (__return_storage_ptr__->
        super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
        ).m_data.ptr = (PixelOffsets *)0x0;
        return __return_storage_ptr__;
      }
      pPVar1 = (PixelOffsets *)operator_new(0x10);
      pPVar1->_vptr_PixelOffsets = (_func_int **)&PTR_operator___00d26f90;
      pPVar1[1]._vptr_PixelOffsets = *(_func_int ***)offsetRange->m_data;
    }
    (__return_storage_ptr__->
    super_UniqueBase<vkt::sr::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::PixelOffsets>_>
    ).m_data.ptr = pPVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static MovePtr<PixelOffsets> makePixelOffsetsFunctor (GatherType gatherType, const GatherArgs& gatherArgs, const IVec2& offsetRange)
{
	if (gatherType == GATHERTYPE_BASIC || gatherType == GATHERTYPE_OFFSET)
	{
		const IVec2 offset = gatherType == GATHERTYPE_BASIC ? IVec2(0) : gatherArgs.offsets[0];
		return MovePtr<PixelOffsets>(new SinglePixelOffsets(offset));
	}
	else if (gatherType == GATHERTYPE_OFFSET_DYNAMIC)
	{
		return MovePtr<PixelOffsets>(new DynamicSinglePixelOffsets(offsetRange));
	}
	else if (gatherType == GATHERTYPE_OFFSETS)
		return MovePtr<PixelOffsets>(new MultiplePixelOffsets(gatherArgs.offsets[0],
															  gatherArgs.offsets[1],
															  gatherArgs.offsets[2],
															  gatherArgs.offsets[3]));
	else
	{
		DE_ASSERT(false);
		return MovePtr<PixelOffsets>(DE_NULL);
	}
}